

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

void qpTestLog_destroy(qpTestLog *log)

{
  if (log->isSessionOpen != 0) {
    qpXmlWriter_flush(log->writer);
    fwrite("\n#endSession\n",0xd,1,(FILE *)log->outputFile);
    qpTestLog_flushFile(log);
    log->isSessionOpen = 0;
  }
  if (log->writer != (qpXmlWriter *)0x0) {
    qpXmlWriter_destroy(log->writer);
  }
  if ((FILE *)log->outputFile != (FILE *)0x0) {
    fclose((FILE *)log->outputFile);
  }
  if (log->lock != 0) {
    deMutex_destroy(log->lock);
  }
  deFree(log);
  return;
}

Assistant:

void qpTestLog_destroy (qpTestLog* log)
{
	DE_ASSERT(log);

	if (log->isSessionOpen)
		endSession(log);

	if (log->writer)
		qpXmlWriter_destroy(log->writer);

	if (log->outputFile)
		fclose(log->outputFile);

	if (log->lock)
		deMutex_destroy(log->lock);

	deFree(log);
}